

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOWriter.cpp
# Opt level: O3

void __thiscall mognetwork::TcpASIOWriter::~TcpASIOWriter(TcpASIOWriter *this)

{
  list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  (this->super_IRunnable)._vptr_IRunnable = (_func_int **)&PTR__TcpASIOWriter_00113c10;
  if (this->m_server == (TcpASIOServer *)0x0) {
    if (this->m_mutex != (Mutex *)0x0) {
      (*this->m_mutex->_vptr_Mutex[1])();
    }
    plVar1 = this->m_socketList;
    if (plVar1 != (list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x0) {
      p_Var3 = (plVar1->
               super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var3 != (_List_node_base *)plVar1) {
        p_Var2 = (((_List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)
                  &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3);
        p_Var3 = p_Var2;
      }
      operator_delete(plVar1);
    }
  }
  if (this->m_thread != (Thread *)0x0) {
    (*this->m_thread->_vptr_Thread[1])();
  }
  CondVar::~CondVar(&this->m_condVar);
  Selector::~Selector(&this->m_selector);
  return;
}

Assistant:

TcpASIOWriter::~TcpASIOWriter()
  {
    if (m_server == NULL) {
      if (m_mutex != NULL)
	delete (m_mutex);
      if (m_socketList != NULL)
	delete (m_socketList);
    }
    delete (m_thread);
  }